

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * glcts::anon_unknown_0::GetInput430c7
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  reference pvVar1;
  reference pvVar2;
  float *fp;
  int *ip;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,0x90);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data,0);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data,0);
  pvVar1[0] = '\x01';
  pvVar1[1] = '\0';
  pvVar1[2] = '\0';
  pvVar1[3] = '\0';
  pvVar1[4] = '\0';
  pvVar1[5] = '\0';
  pvVar1[6] = '\0';
  pvVar1[7] = '\0';
  pvVar1[8] = '\x02';
  pvVar1[9] = '\0';
  pvVar1[10] = '\0';
  pvVar1[0xb] = '\0';
  pvVar1[0xc] = '\x03';
  pvVar1[0xd] = '\0';
  pvVar1[0xe] = '\0';
  pvVar1[0xf] = '\0';
  pvVar2[0x10] = '\0';
  pvVar2[0x11] = '\0';
  pvVar2[0x12] = 0x80;
  pvVar2[0x13] = '@';
  pvVar2[0x14] = '\0';
  pvVar2[0x15] = '\0';
  pvVar2[0x16] = '\0';
  pvVar2[0x17] = '\0';
  pvVar2[0x18] = '\0';
  pvVar2[0x19] = '\0';
  pvVar2[0x1a] = '\0';
  pvVar2[0x1b] = '\0';
  pvVar2[0x1c] = '\0';
  pvVar2[0x1d] = '\0';
  pvVar2[0x1e] = '\0';
  pvVar2[0x1f] = '\0';
  pvVar2[0x20] = '\0';
  pvVar2[0x21] = '\0';
  pvVar2[0x22] = 0xa0;
  pvVar2[0x23] = '@';
  pvVar2[0x24] = '\0';
  pvVar2[0x25] = '\0';
  pvVar2[0x26] = 0xc0;
  pvVar2[0x27] = '@';
  pvVar2[0x28] = '\0';
  pvVar2[0x29] = '\0';
  pvVar2[0x2a] = 0xe0;
  pvVar2[0x2b] = '@';
  pvVar2[0x2c] = '\0';
  pvVar2[0x2d] = '\0';
  pvVar2[0x2e] = '\0';
  pvVar2[0x2f] = '\0';
  pvVar2[0x30] = '\0';
  pvVar2[0x31] = '\0';
  pvVar2[0x32] = '\0';
  pvVar2[0x33] = 'A';
  pvVar2[0x34] = '\0';
  pvVar2[0x35] = '\0';
  pvVar2[0x36] = '\0';
  pvVar2[0x37] = '\0';
  pvVar2[0x38] = '\0';
  pvVar2[0x39] = '\0';
  pvVar2[0x3a] = '\0';
  pvVar2[0x3b] = '\0';
  pvVar2[0x3c] = '\0';
  pvVar2[0x3d] = '\0';
  pvVar2[0x3e] = '\0';
  pvVar2[0x3f] = '\0';
  pvVar2[0x40] = '\0';
  pvVar2[0x41] = '\0';
  pvVar2[0x42] = '\x10';
  pvVar2[0x43] = 'A';
  pvVar2[0x44] = '\0';
  pvVar2[0x45] = '\0';
  pvVar2[0x46] = ' ';
  pvVar2[0x47] = 'A';
  pvVar2[0x48] = '\0';
  pvVar2[0x49] = '\0';
  pvVar2[0x4a] = '0';
  pvVar2[0x4b] = 'A';
  pvVar2[0x4c] = '\0';
  pvVar2[0x4d] = '\0';
  pvVar2[0x4e] = '\0';
  pvVar2[0x4f] = '\0';
  pvVar1[0x50] = '\f';
  pvVar1[0x51] = '\0';
  pvVar1[0x52] = '\0';
  pvVar1[0x53] = '\0';
  pvVar1[0x54] = '\r';
  pvVar1[0x55] = '\0';
  pvVar1[0x56] = '\0';
  pvVar1[0x57] = '\0';
  pvVar1[0x58] = '\x0e';
  pvVar1[0x59] = '\0';
  pvVar1[0x5a] = '\0';
  pvVar1[0x5b] = '\0';
  pvVar1[0x5c] = '\x0f';
  pvVar1[0x5d] = '\0';
  pvVar1[0x5e] = '\0';
  pvVar1[0x5f] = '\0';
  pvVar2[0x60] = '\0';
  pvVar2[0x61] = '\0';
  pvVar2[0x62] = 0x80;
  pvVar2[99] = 'A';
  pvVar2[100] = '\0';
  pvVar2[0x65] = '\0';
  pvVar2[0x66] = '\0';
  pvVar2[0x67] = '\0';
  pvVar2[0x68] = '\0';
  pvVar2[0x69] = '\0';
  pvVar2[0x6a] = '\0';
  pvVar2[0x6b] = '\0';
  pvVar2[0x6c] = '\0';
  pvVar2[0x6d] = '\0';
  pvVar2[0x6e] = '\0';
  pvVar2[0x6f] = '\0';
  pvVar2[0x70] = '\0';
  pvVar2[0x71] = '\0';
  pvVar2[0x72] = 0x88;
  pvVar2[0x73] = 'A';
  pvVar2[0x74] = '\0';
  pvVar2[0x75] = '\0';
  pvVar2[0x76] = 0x90;
  pvVar2[0x77] = 'A';
  pvVar2[0x78] = '\0';
  pvVar2[0x79] = '\0';
  pvVar2[0x7a] = 0x98;
  pvVar2[0x7b] = 'A';
  pvVar2[0x7c] = '\0';
  pvVar2[0x7d] = '\0';
  pvVar2[0x7e] = '\0';
  pvVar2[0x7f] = '\0';
  pvVar1[0x80] = '\x14';
  pvVar1[0x81] = '\0';
  pvVar1[0x82] = '\0';
  pvVar1[0x83] = '\0';
  pvVar1[0x84] = '\x15';
  pvVar1[0x85] = '\0';
  pvVar1[0x86] = '\0';
  pvVar1[0x87] = '\0';
  pvVar1[0x88] = '\x16';
  pvVar1[0x89] = '\0';
  pvVar1[0x8a] = '\0';
  pvVar1[0x8b] = '\0';
  pvVar1[0x8c] = '\x17';
  pvVar1[0x8d] = '\0';
  pvVar1[0x8e] = '\0';
  pvVar1[0x8f] = '\0';
  return 
  "\nstruct Struct0 {\n  ivec2 m0;\n};\nstruct Struct1 {\n  vec3 m0;\n};\nstruct Struct3 {\n  int m0;\n};\nstruct Struct2 {\n  float m0;\n  Struct1 m1;\n  Struct0 m2;\n  int m3;\n  Struct3 m4;\n};\nlayout(std430, binding = 0) buffer Input {\n  int data0;\n  Struct0 data1;\n  float data2;\n  Struct1 data3;\n  Struct2 data4[2];\n} g_input;\nlayout(std430, binding = 1) buffer Output {\n  int data0;\n  Struct0 data1;\n  float data2;\n  Struct1 data3;\n  Struct2 data4[2];\n} g_output;\nvoid main() {\n  g_output.data0 = g_input.data0;\n  g_output.data1 = g_input.data1;\n  g_output.data2 = g_input.data2;\n  g_output.data3 = g_input.data3;\n  for (int i = 0; i < g_input.data4.length(); ++i) g_output.data4[i] = g_input.data4[i];\n}"
  ;
}

Assistant:

const char* GetInput430c7(std::vector<GLubyte>& in_data)
{
	in_data.resize(36 * 4);
	int*   ip = reinterpret_cast<int*>(&in_data[0]);
	float* fp = reinterpret_cast<float*>(&in_data[0]);
	ip[0]	 = 1;
	ip[1]	 = 0;
	ip[2]	 = 2;
	ip[3]	 = 3;
	fp[4]	 = 4.0f;
	fp[5]	 = 0.0f;
	fp[6]	 = 0.0f;
	fp[7]	 = 0.0f;
	fp[8]	 = 5.0f;
	fp[9]	 = 6.0f;
	fp[10]	= 7.0f;
	fp[11]	= 0.0f;
	fp[12]	= 8.0f;
	fp[13]	= 0.0f;
	fp[14]	= 0.0f;
	fp[15]	= 0.0f;
	fp[16]	= 9.0f;
	fp[17]	= 10.0f;
	fp[18]	= 11.0f;
	fp[19]	= 0.0f;
	ip[20]	= 12;
	ip[21]	= 13;
	ip[22]	= 14;
	ip[23]	= 15;
	fp[24]	= 16.0f;
	fp[25]	= 0.0f;
	fp[26]	= 0.0f;
	fp[27]	= 0.0f;
	fp[28]	= 17.0f;
	fp[29]	= 18.0f;
	fp[30]	= 19.0f;
	fp[31]	= 0.0f;
	ip[32]	= 20;
	ip[33]	= 21;
	ip[34]	= 22;
	ip[35]	= 23;

	return NL "struct Struct0 {" NL "  ivec2 m0;" NL "};" NL "struct Struct1 {" NL "  vec3 m0;" NL "};" NL
			  "struct Struct3 {" NL "  int m0;" NL "};" NL "struct Struct2 {" NL "  float m0;" // offset = 0
		NL "  Struct1 m1;"																	   // offset = 16
		NL "  Struct0 m2;"																	   // offset = 32
		NL "  int m3;"																		   // offset = 40
		NL "  Struct3 m4;"																	   // offset = 44
		NL "};" NL "layout(std430, binding = 0) buffer Input {" NL "  int data0;"			   // offset = 0
		NL "  Struct0 data1;"																   // offset = 8
		NL "  float data2;"																	   // offset = 16
		NL "  Struct1 data3;"																   // offset = 32
		NL "  Struct2 data4[2];"															   // offset = 48
		NL "} g_input;" NL "layout(std430, binding = 1) buffer Output {" NL "  int data0;" NL "  Struct0 data1;" NL
			  "  float data2;" NL "  Struct1 data3;" NL "  Struct2 data4[2];" NL "} g_output;" NL "void main() {" NL
			  "  g_output.data0 = g_input.data0;" NL "  g_output.data1 = g_input.data1;" NL
			  "  g_output.data2 = g_input.data2;" NL "  g_output.data3 = g_input.data3;" NL
			  "  for (int i = 0; i < g_input.data4.length(); ++i) g_output.data4[i] = g_input.data4[i];" NL "}";
}